

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::AnimationStack::AnimationStack
          (AnimationStack *this,uint64_t id,Element *element,string *name,Document *doc)

{
  pointer *pppAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  pointer ppCVar3;
  pointer ppCVar4;
  Scope *sc;
  Object *pOVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  AnimationLayer *anim;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_78
  ;
  string local_58;
  AnimationLayer *local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationStack_0025ce78;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).
  super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sc = GetRequiredScope(element);
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"AnimationStack.FbxAnimStack","");
  Util::GetPropertyTable((Util *)&local_78,doc,&local_58,element,sc,true);
  ppCVar4 = local_78.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = local_78.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var6 = (this->props).
           super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ppCVar3;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppCVar4;
  if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
     local_78.
     super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_78.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  Document::GetConnectionsByDestinationSequenced
            (&local_78,doc,(this->super_Object).id,"AnimationLayer");
  std::
  vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
  ::reserve(&this->layers,
            (long)local_78.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_78.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar3 = local_78.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_78.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((((Connection *)p_Var6->_vptr__Sp_counted_base)->prop)._M_string_length == 0) {
        pOVar5 = Connection::SourceObject((Connection *)p_Var6->_vptr__Sp_counted_base);
        if (pOVar5 == (Object *)0x0) {
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "failed to read source object for AnimationLayer->AnimationStack link, ignoring"
                     ,"");
          Util::DOMWarning(&local_58,element);
        }
        else {
          local_38 = (AnimationLayer *)
                     __dynamic_cast(pOVar5,&Object::typeinfo,&AnimationLayer::typeinfo,0);
          if (local_38 != (AnimationLayer *)0x0) {
            __position._M_current =
                 (this->layers).
                 super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->layers).
                super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Assimp::FBX::AnimationLayer_const*,std::allocator<Assimp::FBX::AnimationLayer_const*>>
              ::_M_realloc_insert<Assimp::FBX::AnimationLayer_const*const&>
                        ((vector<Assimp::FBX::AnimationLayer_const*,std::allocator<Assimp::FBX::AnimationLayer_const*>>
                          *)&this->layers,__position,&local_38);
            }
            else {
              *__position._M_current = local_38;
              pppAVar1 = &(this->layers).
                          super__Vector_base<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppAVar1 = *pppAVar1 + 1;
            }
            goto LAB_00190c3c;
          }
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,
                     "source object for ->AnimationStack link is not an AnimationLayer","");
          Util::DOMWarning(&local_58,element);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
LAB_00190c3c:
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var6->_M_use_count;
    } while (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppCVar3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_78.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

AnimationStack::AnimationStack(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Object(id, element, name)
{
    const Scope& sc = GetRequiredScope(element);

    // note: we don't currently use any of these properties so we shouldn't bother if it is missing
    props = GetPropertyTable(doc,"AnimationStack.FbxAnimStack",element,sc, true);

    // resolve attached animation layers
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationLayer");
    layers.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationLayer->AnimationStack link, ignoring",&element);
            continue;
        }

        const AnimationLayer* const anim = dynamic_cast<const AnimationLayer*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationStack link is not an AnimationLayer",&element);
            continue;
        }
        layers.push_back(anim);
    }
}